

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

bool __thiscall
FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>
::hasFastAccess(FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>
                *this)

{
  bool bVar1;
  
  if (((((((this->left_->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts != 0) &&
     (bVar1 = FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>
              ::hasFastAccess(&((this->left_->fadexpr_).right_)->fadexpr_), bVar1)) {
    return (((this->right_->fadexpr_).right_)->dx_).num_elts != 0;
  }
  return false;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}